

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_frame.c
# Opt level: O0

int dwarf_get_fde_n(Dwarf_Fde_conflict *fde_data,Dwarf_Unsigned fde_index,
                   Dwarf_Fde_conflict *returned_fde,Dwarf_Error *error)

{
  Dwarf_Debug pDVar1;
  ulong local_48;
  Dwarf_Unsigned fdecount;
  Dwarf_Debug dbg;
  Dwarf_Error *error_local;
  Dwarf_Fde_conflict *returned_fde_local;
  Dwarf_Unsigned fde_index_local;
  Dwarf_Fde_conflict *fde_data_local;
  
  if (fde_data == (Dwarf_Fde_conflict *)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,100);
    fde_data_local._4_4_ = 1;
  }
  else if (*fde_data == (Dwarf_Fde_conflict)0x0) {
    _dwarf_error((Dwarf_Debug)0x0,error,0x5c);
    fde_data_local._4_4_ = 1;
  }
  else {
    pDVar1 = (*fde_data)->fd_dbg;
    if ((pDVar1 == (Dwarf_Debug)0x0) || (pDVar1->de_magic != 0xebfdebfd)) {
      _dwarf_error_string((Dwarf_Debug)0x0,error,0x5d,
                          "DW_DLE_FDE_DBG_NULL: An fde contains a stale Dwarf_Debug ");
      fde_data_local._4_4_ = 1;
    }
    else {
      if ((*fde_data)->fd_is_eh == '\0') {
        local_48 = pDVar1->de_fde_count;
      }
      else {
        local_48 = pDVar1->de_fde_count_eh;
      }
      if (fde_index < local_48) {
        *returned_fde = fde_data[fde_index];
        fde_data_local._4_4_ = 0;
      }
      else {
        fde_data_local._4_4_ = -1;
      }
    }
  }
  return fde_data_local._4_4_;
}

Assistant:

int
dwarf_get_fde_n(Dwarf_Fde * fde_data,
    Dwarf_Unsigned fde_index,
    Dwarf_Fde * returned_fde, Dwarf_Error * error)
{
    Dwarf_Debug dbg = 0;
    Dwarf_Unsigned fdecount = 0;

    if (fde_data == NULL) {
        _dwarf_error(dbg, error, DW_DLE_FDE_PTR_NULL);
        return DW_DLV_ERROR;
    }

    FDE_NULL_CHECKS_AND_SET_DBG(*fde_data, dbg);
    /* Assumes fde_data table has at least one entry. */
    fdecount = fde_data[0]->fd_is_eh?
        dbg->de_fde_count_eh:dbg->de_fde_count;
    if (fde_index >= fdecount) {
        return DW_DLV_NO_ENTRY;
    }
    *returned_fde = (*(fde_data + fde_index));
    return DW_DLV_OK;
}